

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_example_cpp_64(bool copy_on_write)

{
  const_iterator *pcVar1;
  bool bVar2;
  ostream *poVar3;
  uint64_t *ans;
  size_t sVar4;
  void *__buf;
  size_t sVar5;
  uint64_t uVar6;
  size_type sVar7;
  fd_set *__writefds;
  size_t __n;
  char *__format;
  fd_set *__exceptfds;
  timeval *__timeout;
  uint64_t i;
  uint64_t uVar8;
  long lVar9;
  initializer_list<unsigned_long> l;
  initializer_list<unsigned_long> l_00;
  uint64_t counter;
  Roaring64Map r1;
  uint64_t element;
  const_iterator i_1;
  Roaring64Map a;
  Roaring64Map r2;
  Roaring64Map r3;
  Roaring64Map t;
  Roaring64Map r1_2_3;
  Roaring64Map r2id;
  Roaring64Map z;
  uint32_t values [3];
  Roaring64Map bigunion;
  Roaring64Map r1f;
  Roaring64Map r2i;
  Roaring64Map i1_2;
  Roaring64Map *allmybitmaps [3];
  
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  r1.roarings._M_t._M_impl._0_8_ = 0;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  r1.copyOnWrite = false;
  r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       r1.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  roaring::Roaring64Map::setCopyOnWrite(&r1,copy_on_write);
  for (uVar8 = 100; uVar8 != 1000; uVar8 = uVar8 + 1) {
    roaring::Roaring64Map::add(&r1,uVar8);
  }
  for (lVar9 = 0; lVar9 != 900; lVar9 = lVar9 + 1) {
    roaring::Roaring64Map::add(&r1,lVar9 + 0xc249fdd327780064);
  }
  bVar2 = roaring::Roaring64Map::contains(&r1,0xc249fdd3277801f4);
  _assert_true((ulong)bVar2,"r1.contains((uint64_t)14000000000000000500ull)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x21c);
  roaring::Roaring64Map::cardinality(&r1);
  poVar3 = std::operator<<((ostream *)&std::cout,"Cardinality = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  roaring::Roaring64Map::getSizeInBytes(&r1,true);
  roaring::Roaring64Map::runOptimize(&r1);
  roaring::Roaring64Map::getSizeInBytes(&r1,true);
  poVar3 = std::operator<<((ostream *)&std::cout,"size before run optimize ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," bytes, and after ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," bytes.");
  std::endl<char,std::char_traits<char>>(poVar3);
  __format = (char *)0x5;
  sVar7 = 2;
  __exceptfds = (fd_set *)0x368d117c00;
  __timeout = (timeval *)0x2d98f13692;
  roaring::Roaring64Map::bitmapOf(&r2,5,1);
  roaring::Roaring64Map::printf(&r2,__format);
  putchar(10);
  r2id.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x368d117c00;
  r2id.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x2d98f13692;
  r2id.roarings._M_t._M_impl._0_8_ = 1;
  r2id.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  r2id.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  r2id.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0xc249fdd327780064;
  l._M_len = sVar7;
  l._M_array = (iterator)0x5;
  roaring::Roaring64Map::bitmapOfList(&r2i,&r2id,l);
  bVar2 = roaring::Roaring64Map::operator==(&r2i,&r2);
  _assert_true((ulong)bVar2,"r2i == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x235);
  r3.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x368d117c00;
  r3.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x2d98f13692;
  r3.roarings._M_t._M_impl._0_8_ = 1;
  r3.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  r3.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  r3.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0xc249fdd327780064;
  l_00._M_len = 5;
  l_00._M_array = (iterator)&r3;
  roaring::Roaring64Map::Roaring64Map(&r2id,l_00);
  bVar2 = roaring::Roaring64Map::operator==(&r2id,&r2);
  __writefds = (fd_set *)0x23a;
  _assert_true((ulong)bVar2,"r2id == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x23a);
  roaring::Roaring64Map::select(&r2,4,(fd_set *)&element,__writefds,__exceptfds,__timeout);
  _assert_true((ulong)(element == 0xc249fdd327780064),"element == 14000000000000000100ull",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x23f);
  uVar8 = roaring::Roaring64Map::minimum(&r2);
  _assert_true((ulong)(uVar8 == 1),"r2.minimum() == 1ull",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x241);
  uVar8 = roaring::Roaring64Map::maximum(&r2);
  _assert_true((ulong)(uVar8 == 0xc249fdd327780064),"r2.maximum() == 14000000000000000100ull",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x243);
  uVar8 = roaring::Roaring64Map::rank(&r2,0x368d117c00);
  _assert_true((ulong)(uVar8 == 4),"r2.rank(234294967296ull) == 4ull",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x245);
  values[0] = 2;
  values[1] = 3;
  values[2] = 4;
  roaring::Roaring64Map::Roaring64Map(&r3,3,values);
  roaring::Roaring64Map::setCopyOnWrite(&r3,copy_on_write);
  uVar8 = roaring::Roaring64Map::cardinality(&r1);
  ans = (uint64_t *)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 * 8);
  _assert_true(1,"arr1 != NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x24f);
  roaring::Roaring64Map::toUint64Array(&r1,ans);
  roaring::Roaring64Map::Roaring64Map(&r1f,uVar8,ans);
  operator_delete__(ans);
  bVar2 = roaring::Roaring64Map::operator==(&r1,&r1f);
  _assert_true((ulong)bVar2,"r1 == r1f",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x255);
  roaring::Roaring64Map::Roaring64Map(&z,&r3);
  roaring::Roaring64Map::setCopyOnWrite(&z,copy_on_write);
  bVar2 = roaring::Roaring64Map::operator==(&r3,&z);
  _assert_true((ulong)bVar2,"r3 == z",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x25a);
  roaring::Roaring64Map::operator|(&r1_2_3,&r1,&r2);
  roaring::Roaring64Map::setCopyOnWrite(&r1_2_3,copy_on_write);
  roaring::Roaring64Map::operator|=(&r1_2_3,&r3);
  allmybitmaps[0] = &r1;
  allmybitmaps[1] = &r2;
  allmybitmaps[2] = &r3;
  roaring::Roaring64Map::fastunion(&bigunion,3,allmybitmaps);
  bVar2 = roaring::Roaring64Map::operator==(&r1_2_3,&bigunion);
  __n = 0x264;
  _assert_true((ulong)bVar2,"r1_2_3 == bigunion",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x264);
  roaring::Roaring64Map::operator&(&i1_2,&r1,&r2);
  sVar4 = roaring::Roaring64Map::getSizeInBytes(&r1,true);
  __buf = operator_new__(sVar4);
  roaring::Roaring64Map::write(&r1,(int)__buf,(void *)0x1,__n);
  roaring::Roaring64Map::read((int)&t,__buf,1);
  sVar5 = roaring::Roaring64Map::getSizeInBytes(&t,true);
  _assert_true((ulong)(sVar4 == sVar5),"expectedsize == t.getSizeInBytes()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x26e);
  bVar2 = roaring::Roaring64Map::operator==(&r1,&t);
  _assert_true((ulong)bVar2,"r1 == t",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x26f);
  operator_delete__(__buf);
  counter = 0;
  roaring::Roaring64Map::iterate(&r1,roaring_iterator_sumall64,&counter);
  counter = 0;
  roaring::Roaring64Map::begin(&i_1,&t);
  while( true ) {
    roaring::Roaring64Map::end((Roaring64MapSetBitBiDirectionalIterator *)&a,&t);
    bVar2 = roaring::Roaring64MapSetBitBiDirectionalIterator::operator!=
                      (&i_1,(Roaring64MapSetBitBiDirectionalIterator *)&a);
    uVar8 = counter;
    if (!bVar2) break;
    counter = counter + 1;
    roaring::Roaring64MapSetBitBiDirectionalIterator::operator++
              ((Roaring64MapSetBitBiDirectionalIterator *)&a,&i_1,0);
  }
  uVar6 = roaring::Roaring64Map::cardinality(&t);
  _assert_true((ulong)(uVar8 == uVar6),"counter == t.cardinality()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x280);
  pcVar1 = &i_1.map_iter;
  i_1.i.parent = (roaring_bitmap_t *)0x0;
  i_1.p = (map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           *)0x0;
  i_1.map_iter._M_node = (_Base_ptr)0x0;
  i_1.i.highbits = 0;
  i_1.i.container_it.index = 0;
  i_1.i.current_value._0_1_ = 0;
  i_1.i.container = (container_s *)pcVar1;
  i_1.i._16_8_ = pcVar1;
  roaring::Roaring64Map::add((Roaring64Map *)&i_1,1);
  roaring::Roaring64Map::add((Roaring64Map *)&i_1,2);
  roaring::Roaring64Map::add((Roaring64Map *)&i_1,3);
  uVar8 = roaring::Roaring64Map::cardinality((Roaring64Map *)&i_1);
  _assert_int_equal(3,uVar8,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                    ,0x287);
  roaring::Roaring64Map::Roaring64Map(&a,(Roaring64Map *)&i_1);
  uVar8 = roaring::Roaring64Map::cardinality(&a);
  _assert_int_equal(3,uVar8,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                    ,0x28a);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&a);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&i_1);
  i_1.i.parent = (roaring_bitmap_t *)0x0;
  i_1.p = (map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           *)0x0;
  i_1.map_iter._M_node = (_Base_ptr)0x0;
  i_1.i.highbits = 0;
  i_1.i.container_it.index = 0;
  a.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &a.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
  a.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  i_1.i.current_value._0_1_ = 0;
  a.roarings._M_t._M_impl._0_8_ = 0;
  a.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  a.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  a.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  a.copyOnWrite = false;
  i_1.i.container = (container_s *)pcVar1;
  i_1.i._16_8_ = pcVar1;
  a.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       a.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  roaring::Roaring64Map::add(&a,1);
  roaring::Roaring64Map::add(&a,2);
  roaring::Roaring64Map::add(&a,3);
  uVar8 = roaring::Roaring64Map::cardinality(&a);
  _assert_int_equal(3,uVar8,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                    ,0x293);
  roaring::Roaring64Map::operator=((Roaring64Map *)&i_1,&a);
  uVar8 = roaring::Roaring64Map::cardinality((Roaring64Map *)&i_1);
  _assert_int_equal(3,uVar8,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                    ,0x296);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&a);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&i_1);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&i1_2);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&bigunion);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&r1_2_3);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&z);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&r1f);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&r3);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&r2id);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&r2i);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&r2);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&r1);
  return;
}

Assistant:

void test_example_cpp_64(bool copy_on_write) {
    // create a new empty bitmap
    Roaring64Map r1;
    r1.setCopyOnWrite(copy_on_write);
    // then we can add values
    for (uint64_t i = 100; i < 1000; i++) {
        r1.add(i);
    }
    for (uint64_t i = 14000000000000000100ull; i < 14000000000000001000ull;
         i++) {
        r1.add(i);
    }

    // check whether a value is contained
    assert_true(r1.contains((uint64_t)14000000000000000500ull));

    // compute how many bits there are:
    uint64_t cardinality = r1.cardinality();
    std::cout << "Cardinality = " << cardinality << std::endl;

    // if your bitmaps have long runs, you can compress them by calling
    // run_optimize
    uint64_t size = r1.getSizeInBytes();
    r1.runOptimize();
    uint64_t compact_size = r1.getSizeInBytes();

    std::cout << "size before run optimize " << size << " bytes, and after "
              << compact_size << " bytes." << std::endl;

    // create a new bitmap with varargs
    Roaring64Map r2 =
        Roaring64Map::bitmapOf(5, 1ull, 2ull, 234294967296ull, 195839473298ull,
                               14000000000000000100ull);

    r2.printf();
    printf("\n");
    // create a new bitmap with initializer list
    Roaring64Map r2i = Roaring64Map::bitmapOfList(
        {1, 2, 234294967296, 195839473298, 14000000000000000100ull});
    assert_true(r2i == r2);

    // create a new bitmap directly from initializer list
    Roaring64Map r2id = {1, 2, 234294967296, 195839473298,
                         14000000000000000100ull};
    assert_true(r2id == r2);

    // test select
    uint64_t element;
    r2.select(4, &element);
    assert_true(element == 14000000000000000100ull);

    assert_true(r2.minimum() == 1ull);

    assert_true(r2.maximum() == 14000000000000000100ull);

    assert_true(r2.rank(234294967296ull) == 4ull);

    // we can also create a bitmap from a pointer to 32-bit integers
    const uint32_t values[] = {2, 3, 4};
    Roaring64Map r3(3, values);
    r3.setCopyOnWrite(copy_on_write);

    // we can also go in reverse and go from arrays to bitmaps
    uint64_t card1 = r1.cardinality();
    uint64_t *arr1 = new uint64_t[card1];
    assert_true(arr1 != NULL);
    r1.toUint64Array(arr1);
    Roaring64Map r1f(card1, arr1);
    delete[] arr1;

    // bitmaps shall be equal
    assert_true(r1 == r1f);

    // we can copy and compare bitmaps
    Roaring64Map z(r3);
    z.setCopyOnWrite(copy_on_write);
    assert_true(r3 == z);

    // we can compute union two-by-two
    Roaring64Map r1_2_3 = r1 | r2;
    r1_2_3.setCopyOnWrite(copy_on_write);
    r1_2_3 |= r3;

    // we can compute a big union
    const Roaring64Map *allmybitmaps[] = {&r1, &r2, &r3};
    Roaring64Map bigunion = Roaring64Map::fastunion(3, allmybitmaps);
    assert_true(r1_2_3 == bigunion);

    // we can compute intersection two-by-two
    Roaring64Map i1_2 = r1 & r2;

    // we can write a bitmap to a pointer and recover it later
    size_t expectedsize = r1.getSizeInBytes();
    char *serializedbytes = new char[expectedsize];
    r1.write(serializedbytes);
    Roaring64Map t = Roaring64Map::read(serializedbytes);
    assert_true(expectedsize == t.getSizeInBytes());
    assert_true(r1 == t);
    delete[] serializedbytes;

    // we can iterate over all values using custom functions
    uint64_t counter = 0;
    r1.iterate(roaring_iterator_sumall64, &counter);
    /**
     * void roaring_iterator_sumall64(uint64_t value, void *param) {
     *        *(uint64_t *) param += value;
     *  }
     *
     */
    // we can also iterate the C++ way
    counter = 0;
    for (Roaring64Map::const_iterator i = t.begin(); i != t.end(); i++) {
        ++counter;
    }
    assert_true(counter == t.cardinality());

    {
        Roaring64Map b;
        b.add(1u);
        b.add(2u);
        b.add(3u);
        assert_int_equal(3, b.cardinality());

        Roaring64Map a(std::move(b));
        assert_int_equal(3, a.cardinality());
        // assert_int_equal(0, b.cardinality()); // no: b is now unspecified.
    }

    {
        Roaring64Map a, b;
        b.add(1u);
        b.add(2u);
        b.add(3u);
        assert_int_equal(3, b.cardinality());

        a = std::move(b);
        assert_int_equal(3, a.cardinality());
        // assert_int_equal(0, b.cardinality()); // no: b is unspecified
    }
}